

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<long,_double>::InnerMap::TransferList
          (InnerMap *this,void **table,size_type index)

{
  Node *pNVar1;
  Node *node;
  iterator local_30;
  
  node = (Node *)table[index];
  do {
    pNVar1 = node->next;
    InsertUnique(&local_30,this,this->num_buckets_ - 1 & (this->seed_ | 1) * (node->kv).k_,node);
    node = pNVar1;
  } while (pNVar1 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(*KeyPtrFromNodePtr(node)), node);
        node = next;
      } while (node != NULL);
    }